

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  ulong uVar2;
  undefined8 uVar3;
  Geometry *this;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 (*pauVar8) [16];
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  byte bVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  size_t i;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar42;
  float fVar43;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar44;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar56;
  float fVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  float fVar62;
  float fVar63;
  undefined1 auVar60 [16];
  float fVar64;
  undefined1 auVar61 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1058 [6];
  long local_1040;
  long local_1038;
  ulong local_1030;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  fVar65 = (query->p).field_0.field_0.x;
  fVar69 = (query->p).field_0.field_0.y;
  fVar73 = (query->p).field_0.field_0.z;
  fVar80 = (context->query_radius).field_0.m128[0];
  fVar77 = (context->query_radius).field_0.m128[1];
  fVar78 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar81 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    auVar81 = dpps((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
  }
  pauVar15 = (undefined1 (*) [16])local_f68;
  bVar10 = false;
  local_f98 = fVar65;
  fStack_f94 = fVar65;
  fStack_f90 = fVar65;
  fStack_f8c = fVar65;
  local_fa8 = fVar69;
  fStack_fa4 = fVar69;
  fStack_fa0 = fVar69;
  fStack_f9c = fVar69;
  local_fb8 = fVar73;
  fStack_fb4 = fVar73;
  fStack_fb0 = fVar73;
  fStack_fac = fVar73;
  fVar66 = fVar65;
  fVar67 = fVar65;
  fVar68 = fVar65;
  fVar70 = fVar69;
  fVar71 = fVar69;
  fVar72 = fVar69;
  fVar74 = fVar73;
  fVar75 = fVar73;
  fVar76 = fVar73;
  do {
    local_ff8 = fVar65 - fVar80;
    fStack_ff4 = fVar66 - fVar80;
    fStack_ff0 = fVar67 - fVar80;
    fStack_fec = fVar68 - fVar80;
    local_1008 = fVar65 + fVar80;
    fStack_1004 = fVar66 + fVar80;
    fStack_1000 = fVar67 + fVar80;
    fStack_ffc = fVar68 + fVar80;
    local_1018._0_4_ = fVar69 - fVar77;
    local_1018._4_4_ = fVar70 - fVar77;
    fStack_1010 = fVar71 - fVar77;
    fStack_100c = fVar72 - fVar77;
    local_fd8 = fVar77 + fVar69;
    fStack_fd4 = fVar77 + fVar70;
    fStack_fd0 = fVar77 + fVar71;
    fStack_fcc = fVar77 + fVar72;
    local_1028 = fVar73 - fVar78;
    fStack_1024 = fVar74 - fVar78;
    fStack_1020 = fVar75 - fVar78;
    fStack_101c = fVar76 - fVar78;
    local_fe8._0_4_ = fVar78 + fVar73;
    local_fe8._4_4_ = fVar78 + fVar74;
    fStack_fe0 = fVar78 + fVar75;
    fStack_fdc = fVar78 + fVar76;
    fVar77 = fVar80 * fVar80;
    fVar78 = fVar80 * fVar80;
    fVar79 = fVar80 * fVar80;
    fVar80 = fVar80 * fVar80;
    local_f88 = fVar77;
    fStack_f84 = fVar78;
    fStack_f80 = fVar79;
    fStack_f7c = fVar80;
    local_fc8 = auVar81;
LAB_0069b5be:
    do {
      do {
        if (pauVar15 == (undefined1 (*) [16])&local_f78) {
          return bVar10;
        }
        pauVar8 = pauVar15 + -1;
        pauVar15 = pauVar15 + -1;
      } while (auVar81._0_4_ < *(float *)((long)*pauVar8 + 8));
      uVar12 = *(ulong *)*pauVar15;
LAB_0069b5dc:
      uVar13 = (uint)uVar12;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar12 & 8) != 0) goto LAB_0069b9fb;
        uVar11 = uVar12 & 0xfffffffffffffff0;
        fVar35 = query->time;
        auVar29._4_4_ = fVar35;
        auVar29._0_4_ = fVar35;
        auVar29._8_4_ = fVar35;
        auVar29._12_4_ = fVar35;
        auVar32._0_4_ = *(float *)(uVar11 + 0x80) * fVar35 + *(float *)(uVar11 + 0x20);
        auVar32._4_4_ = *(float *)(uVar11 + 0x84) * fVar35 + *(float *)(uVar11 + 0x24);
        auVar32._8_4_ = *(float *)(uVar11 + 0x88) * fVar35 + *(float *)(uVar11 + 0x28);
        auVar32._12_4_ = *(float *)(uVar11 + 0x8c) * fVar35 + *(float *)(uVar11 + 0x2c);
        auVar30._0_4_ = *(float *)(uVar11 + 0xa0) * fVar35 + *(float *)(uVar11 + 0x40);
        auVar30._4_4_ = *(float *)(uVar11 + 0xa4) * fVar35 + *(float *)(uVar11 + 0x44);
        auVar30._8_4_ = *(float *)(uVar11 + 0xa8) * fVar35 + *(float *)(uVar11 + 0x48);
        auVar30._12_4_ = *(float *)(uVar11 + 0xac) * fVar35 + *(float *)(uVar11 + 0x4c);
        auVar27._0_4_ = *(float *)(uVar11 + 0xc0) * fVar35 + *(float *)(uVar11 + 0x60);
        auVar27._4_4_ = *(float *)(uVar11 + 0xc4) * fVar35 + *(float *)(uVar11 + 100);
        auVar27._8_4_ = *(float *)(uVar11 + 200) * fVar35 + *(float *)(uVar11 + 0x68);
        auVar27._12_4_ = *(float *)(uVar11 + 0xcc) * fVar35 + *(float *)(uVar11 + 0x6c);
        auVar38._0_4_ = *(float *)(uVar11 + 0x90) * fVar35 + *(float *)(uVar11 + 0x30);
        auVar38._4_4_ = *(float *)(uVar11 + 0x94) * fVar35 + *(float *)(uVar11 + 0x34);
        auVar38._8_4_ = *(float *)(uVar11 + 0x98) * fVar35 + *(float *)(uVar11 + 0x38);
        auVar38._12_4_ = *(float *)(uVar11 + 0x9c) * fVar35 + *(float *)(uVar11 + 0x3c);
        auVar50._0_4_ = *(float *)(uVar11 + 0xb0) * fVar35 + *(float *)(uVar11 + 0x50);
        auVar50._4_4_ = *(float *)(uVar11 + 0xb4) * fVar35 + *(float *)(uVar11 + 0x54);
        auVar50._8_4_ = *(float *)(uVar11 + 0xb8) * fVar35 + *(float *)(uVar11 + 0x58);
        auVar50._12_4_ = *(float *)(uVar11 + 0xbc) * fVar35 + *(float *)(uVar11 + 0x5c);
        auVar46._0_4_ = *(float *)(uVar11 + 0xd0) * fVar35 + *(float *)(uVar11 + 0x70);
        auVar46._4_4_ = *(float *)(uVar11 + 0xd4) * fVar35 + *(float *)(uVar11 + 0x74);
        auVar46._8_4_ = *(float *)(uVar11 + 0xd8) * fVar35 + *(float *)(uVar11 + 0x78);
        auVar46._12_4_ = *(float *)(uVar11 + 0xdc) * fVar35 + *(float *)(uVar11 + 0x7c);
        auVar54._4_4_ = fVar66;
        auVar54._0_4_ = fVar65;
        auVar54._8_4_ = fVar67;
        auVar54._12_4_ = fVar68;
        auVar40 = maxps(auVar54,auVar32);
        auVar40 = minps(auVar40,auVar38);
        fVar35 = auVar40._0_4_ - fVar65;
        fVar43 = auVar40._4_4_ - fVar66;
        fVar51 = auVar40._8_4_ - fVar67;
        fVar57 = auVar40._12_4_ - fVar68;
        auVar61._4_4_ = fVar70;
        auVar61._0_4_ = fVar69;
        auVar61._8_4_ = fVar71;
        auVar61._12_4_ = fVar72;
        auVar40 = maxps(auVar61,auVar30);
        auVar40 = minps(auVar40,auVar50);
        fVar59 = auVar40._0_4_ - fVar69;
        fVar62 = auVar40._4_4_ - fVar70;
        fVar63 = auVar40._8_4_ - fVar71;
        fVar64 = auVar40._12_4_ - fVar72;
        auVar55._4_4_ = fVar74;
        auVar55._0_4_ = fVar73;
        auVar55._8_4_ = fVar75;
        auVar55._12_4_ = fVar76;
        auVar40 = maxps(auVar55,auVar27);
        auVar40 = minps(auVar40,auVar46);
        fVar42 = auVar40._0_4_ - fVar73;
        fVar44 = auVar40._4_4_ - fVar74;
        fVar56 = auVar40._8_4_ - fVar75;
        fVar58 = auVar40._12_4_ - fVar76;
        local_1058[0] = fVar42 * fVar42 + fVar59 * fVar59 + fVar35 * fVar35;
        local_1058[1] = fVar44 * fVar44 + fVar62 * fVar62 + fVar43 * fVar43;
        local_1058[2] = fVar56 * fVar56 + fVar63 * fVar63 + fVar51 * fVar51;
        local_1058[3] = fVar58 * fVar58 + fVar64 * fVar64 + fVar57 * fVar57;
        uVar6 = (uint)(((auVar27._0_4_ <= (float)local_fe8._0_4_ && local_ff8 <= auVar38._0_4_) &&
                       (auVar30._0_4_ <= local_fd8 && auVar32._0_4_ <= local_1008)) &&
                      (local_1028 <= auVar46._0_4_ &&
                      ((float)local_1018._0_4_ <= auVar50._0_4_ && auVar32._0_4_ <= auVar38._0_4_)))
        ;
        auVar53._0_4_ = -uVar6;
        uVar7 = (uint)(((auVar27._4_4_ <= (float)local_fe8._4_4_ && fStack_ff4 <= auVar38._4_4_) &&
                       (auVar30._4_4_ <= fStack_fd4 && auVar32._4_4_ <= fStack_1004)) &&
                      (fStack_1024 <= auVar46._4_4_ &&
                      ((float)local_1018._4_4_ <= auVar50._4_4_ && auVar32._4_4_ <= auVar38._4_4_)))
        ;
        auVar53._4_4_ = -uVar7;
        uVar5 = (uint)(((auVar27._8_4_ <= fStack_fe0 && fStack_ff0 <= auVar38._8_4_) &&
                       (auVar30._8_4_ <= fStack_fd0 && auVar32._8_4_ <= fStack_1000)) &&
                      (fStack_1020 <= auVar46._8_4_ &&
                      (fStack_1010 <= auVar50._8_4_ && auVar32._8_4_ <= auVar38._8_4_)));
        auVar53._8_4_ = -uVar5;
        uVar4 = (uint)(((auVar27._12_4_ <= fStack_fdc && fStack_fec <= auVar38._12_4_) &&
                       (auVar30._12_4_ <= fStack_fcc && auVar32._12_4_ <= fStack_ffc)) &&
                      (fStack_101c <= auVar46._12_4_ &&
                      (fStack_100c <= auVar50._12_4_ && auVar32._12_4_ <= auVar38._12_4_)));
        auVar53._12_4_ = -uVar4;
        if ((uVar13 & 7) == 6) goto LAB_0069b804;
        auVar53._0_4_ = uVar6 * -0x80000000;
        auVar53._4_4_ = uVar7 * -0x80000000;
        auVar53._8_4_ = uVar5 * -0x80000000;
        auVar53._12_4_ = uVar4 * -0x80000000;
LAB_0069b6b3:
        uVar13 = movmskps(uVar13 & 7,auVar53);
LAB_0069b6b6:
        if (uVar13 != 0) {
          uVar11 = uVar12 & 0xfffffffffffffff0;
          lVar16 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar12 = *(ulong *)(uVar11 + lVar16 * 8);
          uVar13 = uVar13 - 1 & uVar13;
          if (uVar13 != 0) {
            fVar35 = local_1058[lVar16];
            lVar16 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
              }
            }
            uVar2 = *(ulong *)(uVar11 + lVar16 * 8);
            fVar42 = local_1058[lVar16];
            uVar13 = uVar13 - 1 & uVar13;
            if (uVar13 == 0) {
              if ((uint)fVar35 < (uint)fVar42) {
                *(ulong *)*pauVar15 = uVar2;
                *(float *)((long)*pauVar15 + 8) = fVar42;
                pauVar15 = pauVar15 + 1;
              }
              else {
                *(ulong *)*pauVar15 = uVar12;
                *(float *)((long)*pauVar15 + 8) = fVar35;
                pauVar15 = pauVar15 + 1;
                uVar12 = uVar2;
              }
            }
            else {
              auVar28._8_4_ = fVar35;
              auVar28._0_8_ = uVar12;
              auVar28._12_4_ = 0;
              auVar33._8_4_ = fVar42;
              auVar33._0_8_ = uVar2;
              auVar33._12_4_ = 0;
              lVar16 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                }
              }
              uVar3 = *(undefined8 *)(uVar11 + lVar16 * 8);
              fVar43 = local_1058[lVar16];
              auVar31._8_4_ = fVar43;
              auVar31._0_8_ = uVar3;
              auVar31._12_4_ = 0;
              auVar19._8_4_ = -(uint)((int)fVar35 < (int)fVar42);
              uVar13 = uVar13 - 1 & uVar13;
              if (uVar13 == 0) {
                auVar19._4_4_ = auVar19._8_4_;
                auVar19._0_4_ = auVar19._8_4_;
                auVar19._12_4_ = auVar19._8_4_;
                auVar39._8_4_ = fVar42;
                auVar39._0_8_ = uVar2;
                auVar39._12_4_ = 0;
                auVar40 = blendvps(auVar39,auVar28,auVar19);
                auVar29 = blendvps(auVar28,auVar33,auVar19);
                auVar20._8_4_ = -(uint)(auVar40._8_4_ < (int)fVar43);
                auVar20._4_4_ = auVar20._8_4_;
                auVar20._0_4_ = auVar20._8_4_;
                auVar20._12_4_ = auVar20._8_4_;
                auVar34._8_4_ = fVar43;
                auVar34._0_8_ = uVar3;
                auVar34._12_4_ = 0;
                auVar53 = blendvps(auVar34,auVar40,auVar20);
                auVar41 = blendvps(auVar40,auVar31,auVar20);
                auVar21._8_4_ = -(uint)(auVar29._8_4_ < auVar41._8_4_);
                auVar21._4_4_ = auVar21._8_4_;
                auVar21._0_4_ = auVar21._8_4_;
                auVar21._12_4_ = auVar21._8_4_;
                auVar40 = blendvps(auVar41,auVar29,auVar21);
                auVar29 = blendvps(auVar29,auVar41,auVar21);
                *pauVar15 = auVar29;
                pauVar15[1] = auVar40;
                uVar12 = auVar53._0_8_;
                pauVar15 = pauVar15 + 2;
              }
              else {
                lVar16 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                  }
                }
                auVar22._4_4_ = auVar19._8_4_;
                auVar22._0_4_ = auVar19._8_4_;
                auVar22._8_4_ = auVar19._8_4_;
                auVar22._12_4_ = auVar19._8_4_;
                auVar41 = blendvps(auVar33,auVar28,auVar22);
                auVar29 = blendvps(auVar28,auVar33,auVar22);
                auVar47._8_4_ = local_1058[lVar16];
                auVar47._0_8_ = *(undefined8 *)(uVar11 + lVar16 * 8);
                auVar47._12_4_ = 0;
                auVar23._8_4_ = -(uint)((int)fVar43 < (int)local_1058[lVar16]);
                auVar23._4_4_ = auVar23._8_4_;
                auVar23._0_4_ = auVar23._8_4_;
                auVar23._12_4_ = auVar23._8_4_;
                auVar53 = blendvps(auVar47,auVar31,auVar23);
                auVar40 = blendvps(auVar31,auVar47,auVar23);
                auVar24._8_4_ = -(uint)(auVar29._8_4_ < auVar40._8_4_);
                auVar24._4_4_ = auVar24._8_4_;
                auVar24._0_4_ = auVar24._8_4_;
                auVar24._12_4_ = auVar24._8_4_;
                auVar48 = blendvps(auVar40,auVar29,auVar24);
                auVar29 = blendvps(auVar29,auVar40,auVar24);
                auVar25._8_4_ = -(uint)(auVar41._8_4_ < auVar53._8_4_);
                auVar25._4_4_ = auVar25._8_4_;
                auVar25._0_4_ = auVar25._8_4_;
                auVar25._12_4_ = auVar25._8_4_;
                auVar40 = blendvps(auVar53,auVar41,auVar25);
                auVar41 = blendvps(auVar41,auVar53,auVar25);
                auVar26._8_4_ = -(uint)(auVar41._8_4_ < auVar48._8_4_);
                auVar26._4_4_ = auVar26._8_4_;
                auVar26._0_4_ = auVar26._8_4_;
                auVar26._12_4_ = auVar26._8_4_;
                auVar53 = blendvps(auVar48,auVar41,auVar26);
                auVar41 = blendvps(auVar41,auVar48,auVar26);
                *pauVar15 = auVar29;
                pauVar15[1] = auVar41;
                pauVar15[2] = auVar53;
                uVar12 = auVar40._0_8_;
                pauVar15 = pauVar15 + 3;
              }
            }
          }
          goto LAB_0069b5dc;
        }
        goto LAB_0069b5be;
      }
      if ((uVar12 & 8) == 0) {
        uVar11 = uVar12 & 0xfffffffffffffff0;
        fVar35 = query->time;
        auVar29._4_4_ = fVar35;
        auVar29._0_4_ = fVar35;
        auVar29._8_4_ = fVar35;
        auVar29._12_4_ = fVar35;
        auVar40._0_4_ = *(float *)(uVar11 + 0x80) * fVar35 + *(float *)(uVar11 + 0x20);
        auVar40._4_4_ = *(float *)(uVar11 + 0x84) * fVar35 + *(float *)(uVar11 + 0x24);
        auVar40._8_4_ = *(float *)(uVar11 + 0x88) * fVar35 + *(float *)(uVar11 + 0x28);
        auVar40._12_4_ = *(float *)(uVar11 + 0x8c) * fVar35 + *(float *)(uVar11 + 0x2c);
        auVar36._0_4_ = *(float *)(uVar11 + 0xa0) * fVar35 + *(float *)(uVar11 + 0x40);
        auVar36._4_4_ = *(float *)(uVar11 + 0xa4) * fVar35 + *(float *)(uVar11 + 0x44);
        auVar36._8_4_ = *(float *)(uVar11 + 0xa8) * fVar35 + *(float *)(uVar11 + 0x48);
        auVar36._12_4_ = *(float *)(uVar11 + 0xac) * fVar35 + *(float *)(uVar11 + 0x4c);
        auVar48._0_4_ = *(float *)(uVar11 + 0xc0) * fVar35 + *(float *)(uVar11 + 0x60);
        auVar48._4_4_ = *(float *)(uVar11 + 0xc4) * fVar35 + *(float *)(uVar11 + 100);
        auVar48._8_4_ = *(float *)(uVar11 + 200) * fVar35 + *(float *)(uVar11 + 0x68);
        auVar48._12_4_ = *(float *)(uVar11 + 0xcc) * fVar35 + *(float *)(uVar11 + 0x6c);
        auVar41._0_4_ = *(float *)(uVar11 + 0x90) * fVar35 + *(float *)(uVar11 + 0x30);
        auVar41._4_4_ = *(float *)(uVar11 + 0x94) * fVar35 + *(float *)(uVar11 + 0x34);
        auVar41._8_4_ = *(float *)(uVar11 + 0x98) * fVar35 + *(float *)(uVar11 + 0x38);
        auVar41._12_4_ = *(float *)(uVar11 + 0x9c) * fVar35 + *(float *)(uVar11 + 0x3c);
        auVar45._0_4_ = *(float *)(uVar11 + 0xb0) * fVar35 + *(float *)(uVar11 + 0x50);
        auVar45._4_4_ = *(float *)(uVar11 + 0xb4) * fVar35 + *(float *)(uVar11 + 0x54);
        auVar45._8_4_ = *(float *)(uVar11 + 0xb8) * fVar35 + *(float *)(uVar11 + 0x58);
        auVar45._12_4_ = *(float *)(uVar11 + 0xbc) * fVar35 + *(float *)(uVar11 + 0x5c);
        auVar49._0_4_ = *(float *)(uVar11 + 0xd0) * fVar35 + *(float *)(uVar11 + 0x70);
        auVar49._4_4_ = *(float *)(uVar11 + 0xd4) * fVar35 + *(float *)(uVar11 + 0x74);
        auVar49._8_4_ = *(float *)(uVar11 + 0xd8) * fVar35 + *(float *)(uVar11 + 0x78);
        auVar49._12_4_ = *(float *)(uVar11 + 0xdc) * fVar35 + *(float *)(uVar11 + 0x7c);
        auVar52._4_4_ = fVar66;
        auVar52._0_4_ = fVar65;
        auVar52._8_4_ = fVar67;
        auVar52._12_4_ = fVar68;
        auVar53 = maxps(auVar52,auVar40);
        auVar53 = minps(auVar53,auVar41);
        fVar51 = auVar53._0_4_ - fVar65;
        fVar56 = auVar53._4_4_ - fVar66;
        fVar57 = auVar53._8_4_ - fVar67;
        fVar58 = auVar53._12_4_ - fVar68;
        auVar60._4_4_ = fVar70;
        auVar60._0_4_ = fVar69;
        auVar60._8_4_ = fVar71;
        auVar60._12_4_ = fVar72;
        auVar53 = maxps(auVar60,auVar36);
        auVar53 = minps(auVar53,auVar45);
        fVar59 = auVar53._0_4_ - fVar69;
        fVar62 = auVar53._4_4_ - fVar70;
        fVar63 = auVar53._8_4_ - fVar71;
        fVar64 = auVar53._12_4_ - fVar72;
        auVar37._4_4_ = fVar74;
        auVar37._0_4_ = fVar73;
        auVar37._8_4_ = fVar75;
        auVar37._12_4_ = fVar76;
        auVar53 = maxps(auVar37,auVar48);
        auVar53 = minps(auVar53,auVar49);
        fVar35 = auVar53._0_4_ - fVar73;
        fVar42 = auVar53._4_4_ - fVar74;
        fVar43 = auVar53._8_4_ - fVar75;
        fVar44 = auVar53._12_4_ - fVar76;
        local_1058[0] = fVar35 * fVar35 + fVar59 * fVar59 + fVar51 * fVar51;
        local_1058[1] = fVar42 * fVar42 + fVar62 * fVar62 + fVar56 * fVar56;
        local_1058[2] = fVar43 * fVar43 + fVar63 * fVar63 + fVar57 * fVar57;
        local_1058[3] = fVar44 * fVar44 + fVar64 * fVar64 + fVar58 * fVar58;
        auVar53._0_4_ = -(uint)(auVar40._0_4_ <= auVar41._0_4_ && local_1058[0] <= fVar77);
        auVar53._4_4_ = -(uint)(auVar40._4_4_ <= auVar41._4_4_ && local_1058[1] <= fVar78);
        auVar53._8_4_ = -(uint)(auVar40._8_4_ <= auVar41._8_4_ && local_1058[2] <= fVar79);
        auVar53._12_4_ = -(uint)(auVar40._12_4_ <= auVar41._12_4_ && local_1058[3] <= fVar80);
        if ((uVar13 & 7) != 6) goto LAB_0069b6b3;
LAB_0069b804:
        uVar11 = uVar12 & 0xfffffffffffffff0;
        auVar18._0_4_ =
             (-(uint)(auVar29._0_4_ < *(float *)(uVar11 + 0xf0) &&
                     *(float *)(uVar11 + 0xe0) <= auVar29._0_4_) & auVar53._0_4_) << 0x1f;
        auVar18._4_4_ =
             (-(uint)(auVar29._4_4_ < *(float *)(uVar11 + 0xf4) &&
                     *(float *)(uVar11 + 0xe4) <= auVar29._4_4_) & auVar53._4_4_) << 0x1f;
        auVar18._8_4_ =
             (-(uint)(auVar29._8_4_ < *(float *)(uVar11 + 0xf8) &&
                     *(float *)(uVar11 + 0xe8) <= auVar29._8_4_) & auVar53._8_4_) << 0x1f;
        auVar18._12_4_ =
             (-(uint)(auVar29._12_4_ < *(float *)(uVar11 + 0xfc) &&
                     *(float *)(uVar11 + 0xec) <= auVar29._12_4_) & auVar53._12_4_) << 0x1f;
        uVar13 = movmskps(uVar13 & 7,auVar18);
        goto LAB_0069b6b6;
      }
LAB_0069b9fb:
      local_1040 = (ulong)(uVar13 & 0xf) - 8;
      lVar16 = (uVar12 & 0xfffffffffffffff0) + 0x50;
      local_1030 = 0;
      for (local_1038 = 0; local_1038 != local_1040; local_1038 = local_1038 + 1) {
        bVar14 = 0;
        for (lVar17 = 0; (lVar17 != 4 && (*(int *)(lVar16 + lVar17 * 4) != -1)); lVar17 = lVar17 + 1
            ) {
          uVar13 = *(uint *)(lVar16 + -0x10 + lVar17 * 4);
          this = (context->scene->geometries).items[uVar13].ptr;
          context->geomID = uVar13;
          context->primID = *(uint *)(lVar16 + lVar17 * 4);
          bVar9 = Geometry::pointQuery(this,query,context);
          bVar14 = bVar14 | bVar9;
          fVar65 = local_f98;
          fVar66 = fStack_f94;
          fVar67 = fStack_f90;
          fVar68 = fStack_f8c;
          fVar69 = local_fa8;
          fVar70 = fStack_fa4;
          fVar71 = fStack_fa0;
          fVar72 = fStack_f9c;
          fVar73 = local_fb8;
          fVar74 = fStack_fb4;
          fVar75 = fStack_fb0;
          fVar76 = fStack_fac;
          fVar77 = local_f88;
          fVar78 = fStack_f84;
          fVar79 = fStack_f80;
          fVar80 = fStack_f7c;
        }
        local_1030 = CONCAT71((int7)(local_1030 >> 8),(byte)local_1030 | bVar14);
        lVar16 = lVar16 + 0x60;
        auVar81 = local_fc8;
      }
    } while ((local_1030 & 1) == 0);
    auVar81 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    fVar80 = auVar81._0_4_;
    fVar77 = auVar81._4_4_;
    fVar78 = auVar81._8_4_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar81 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      auVar81 = dpps(auVar81,auVar81,0x7f);
    }
    bVar10 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }